

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyEncodingSynapse.cpp
# Opt level: O1

void __thiscall
LatencyEncodingSynapse::initialize(LatencyEncodingSynapse *this,Population *n_from,Population *n_to)

{
  double *__ptr;
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  Event *in_RAX;
  double *__tmp;
  Clock *pCVar5;
  Logging *pLVar6;
  double *pdVar7;
  undefined8 *puVar8;
  Event *pEVar9;
  ostream *poVar10;
  uint uVar11;
  ulong uVar12;
  long __tmp_1;
  long lVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Event *local_38;
  
  local_38 = in_RAX;
  iVar4 = (*n_from->_vptr_Population[1])(n_from);
  this->inputSize = iVar4;
  iVar4 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar4;
  if (this->inputSize != iVar4) {
    poVar10 = std::operator<<((ostream *)&std::cout,
                              "Number of input neurons not equal to number of output neurons");
    std::endl<char,std::char_traits<char>>(poVar10);
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = "Number of input neurons not equal to number of output neurons";
    __cxa_throw(puVar8,&char_const*::typeinfo,0);
  }
  (this->super_Synapse).from_population = n_from;
  (this->super_Synapse).to_population = n_to;
  pCVar5 = Clock::getInstance();
  this->clock = pCVar5;
  pLVar6 = Logging::getInstance();
  this->logger = pLVar6;
  iVar4 = this->inputSize;
  lVar13 = (long)iVar4;
  if (lVar13 < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (iVar4 == 0) {
    pdVar7 = (double *)0x0;
  }
  else {
    pdVar7 = (double *)malloc(lVar13 * 8);
    if (iVar4 != 1 && ((ulong)pdVar7 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/util/Memory.h"
                    ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar7 == (double *)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar8 = std::ostream::_M_insert<long>;
      __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  __ptr = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_data;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = pdVar7;
  (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = lVar13;
  free(__ptr);
  uVar1 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (-1 < (long)uVar1) {
    pdVar7 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    if (1 < (long)uVar1) {
      uVar12 = 0;
      do {
        pdVar7[uVar12] = -1.0;
        (pdVar7 + uVar12)[1] = -1.0;
        uVar12 = uVar12 + 2;
      } while (uVar12 < (uVar1 & 0x7ffffffffffffffe));
    }
    auVar3 = _DAT_00118050;
    auVar2 = _DAT_00118040;
    if ((long)(uVar1 & 0x7ffffffffffffffe) < (long)uVar1) {
      uVar11 = (uint)uVar1 & 1;
      lVar13 = (ulong)uVar11 - 1;
      auVar15._8_4_ = (int)lVar13;
      auVar15._0_8_ = lVar13;
      auVar15._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar12 = 0;
      auVar15 = auVar15 ^ _DAT_00118050;
      do {
        auVar16._8_4_ = (int)uVar12;
        auVar16._0_8_ = uVar12;
        auVar16._12_4_ = (int)(uVar12 >> 0x20);
        auVar16 = (auVar16 | auVar2) ^ auVar3;
        if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                    auVar15._4_4_ < auVar16._4_4_) & 1)) {
          pdVar7[(uVar1 & 0xfffffffffffffffe) + uVar12] = -1.0;
        }
        if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
            auVar16._12_4_ <= auVar15._12_4_) {
          pdVar7[(uVar1 & 0xfffffffffffffffe) + uVar12 + 1] = -1.0;
        }
        uVar12 = uVar12 + 2;
      } while ((uVar11 + 1 & 0xfffffffe) != uVar12);
    }
    this->currentWindow = this->param->window_length_s;
    if (0 < this->inputSize) {
      iVar4 = 0;
      do {
        pEVar9 = (Event *)operator_new(0x18);
        pEVar9->type = No;
        pEVar9->_vptr_Event = (_func_int **)&PTR_setWeight_00122a58;
        pCVar5 = Clock::getInstance();
        dVar14 = Clock::getCurrentTime(pCVar5);
        pEVar9->eventTime = dVar14;
        local_38 = pEVar9;
        std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                  ((vector<Event*,std::allocator<Event*>> *)&this->output,&local_38);
        iVar4 = iVar4 + 1;
      } while (iVar4 < this->inputSize);
    }
    return;
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void LatencyEncodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    spikeTimes = Eigen::VectorXd(inputSize);
    spikeTimes.setConstant(-1);
    currentWindow = param->window_length_s;
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new NoEvent());
    }
}